

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<std::array<int,2ul>>
          (AsciiParser *this,char sep,char end_symbol,
          vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *result)

{
  pointer *ppaVar1;
  pointer paVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  bool bVar5;
  ulong uVar6;
  char cVar7;
  array<int,_2UL> value;
  array<int,_2UL> value_1;
  array<int,_2UL> local_58;
  string local_50;
  
  paVar2 = (result->super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != paVar2) {
    (result->super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = paVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (bVar5) {
    bVar5 = ParseBasicTypeTuple<int,2ul>(this,&local_58);
    if (bVar5) {
      iVar3._M_current =
           (result->super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>)
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>::
        _M_realloc_insert<std::array<int,2ul>const&>
                  ((vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>> *)result,iVar3,
                   &local_58);
      }
      else {
        *(ulong *)(iVar3._M_current)->_M_elems =
             CONCAT71(local_58._M_elems._1_7_,(char)local_58._M_elems[0]);
        ppaVar1 = &(result->
                   super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Not starting with the value of requested type.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar5) {
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_0038f82e;
        bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = Char1(this,(char *)&local_58);
        cVar7 = '\x01';
        if (bVar5) {
          if ((char)local_58._M_elems[0] == sep) {
            bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar5) {
              bVar5 = LookChar1(this,(char *)&local_50);
              cVar7 = ((char)local_50._M_dataplus._M_p == end_symbol) * '\x03';
              if (!bVar5) {
                cVar7 = '\x01';
              }
              if ((char)local_50._M_dataplus._M_p != end_symbol && bVar5) goto LAB_0038f7a1;
            }
          }
          else {
LAB_0038f7a1:
            if ((char)local_58._M_elems[0] == sep) {
              cVar7 = '\x01';
              bVar5 = SkipWhitespaceAndNewline(this,true);
              if (bVar5) {
                bVar5 = ParseBasicTypeTuple<int,2ul>(this,(array<int,_2UL> *)&local_50);
                cVar7 = '\x03';
                if (bVar5) {
                  iVar3._M_current =
                       (result->
                       super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (result->
                      super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>::
                    _M_realloc_insert<std::array<int,2ul>const&>
                              ((vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>> *)
                               result,iVar3,(array<int,_2UL> *)&local_50);
                  }
                  else {
                    *(pointer *)(iVar3._M_current)->_M_elems = local_50._M_dataplus._M_p;
                    ppaVar1 = &(result->
                               super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppaVar1 = *ppaVar1 + 1;
                  }
                  cVar7 = '\0';
                }
              }
            }
            else {
              pSVar4 = this->_sr;
              cVar7 = '\x03';
              if ((0 < (long)pSVar4->idx_) && (uVar6 = pSVar4->idx_ - 1, uVar6 <= pSVar4->length_))
              {
                pSVar4->idx_ = uVar6;
              }
            }
          }
        }
      } while (cVar7 == '\0');
      if (cVar7 != '\x01') {
LAB_0038f82e:
        if ((result->
            super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>).
            _M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Empty array.\n","");
        PushError(this,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}